

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOutFee
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset)

{
  wally_tx *tx;
  uint uVar1;
  size_type sVar2;
  undefined8 uVar3;
  uchar *asset_00;
  uchar *value_00;
  size_type value_len;
  string *in_stack_fffffffffffffd20;
  string *message;
  undefined8 in_stack_fffffffffffffd28;
  CfdError CVar4;
  CfdException *in_stack_fffffffffffffd30;
  CfdException *this_00;
  undefined1 local_248 [8];
  ConfidentialTxOut out;
  string local_148 [32];
  CfdSourceLocation local_128;
  int local_10c;
  undefined1 local_108 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *asset_data;
  ConfidentialValue confidential_value;
  allocator local_59;
  string local_58 [32];
  CfdSourceLocation local_38;
  ConfidentialAssetId *local_20;
  ConfidentialAssetId *asset_local;
  Amount *value_local;
  ConfidentialTransaction *this_local;
  
  CVar4 = (CfdError)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  local_20 = asset;
  asset_local = (ConfidentialAssetId *)value;
  value_local = (Amount *)this;
  sVar2 = ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          ::size(&this->vout_);
  uVar1 = ::std::numeric_limits<unsigned_int>::max();
  if (sVar2 == uVar1) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x8bd;
    local_38.funcname = "AddTxOutFee";
    logger::warn<>(&local_38,"vout maximum.");
    confidential_value._35_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"vout maximum.",&local_59);
    CfdException::CfdException(in_stack_fffffffffffffd30,CVar4,in_stack_fffffffffffffd20);
    confidential_value._35_1_ = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConfidentialValue::ConfidentialValue((ConfidentialValue *)&asset_data,(Amount *)asset_local);
  ConfidentialAssetId::GetData((ByteData *)&value_data,local_20);
  ByteData::GetBytes(&local_b8,(ByteData *)&value_data);
  ByteData::~ByteData((ByteData *)0x4b052c);
  local_a0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8;
  ConfidentialValue::GetData((ByteData *)local_108,(ConfidentialValue *)&asset_data);
  ByteData::GetBytes(&local_f0,(ByteData *)local_108);
  ByteData::~ByteData((ByteData *)0x4b0570);
  local_d8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0;
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  asset_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_a0);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_a0);
  value_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_d8);
  value_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_d8);
  this_00 = (CfdException *)0x0;
  CVar4 = kCfdSuccess;
  message = (string *)0x0;
  local_10c = wally_tx_add_elements_raw_output
                        (tx,(uchar *)0x0,0,asset_00,sVar2,value_00,value_len,(uchar *)0x0,0,
                         (uchar *)0x0,0,(uchar *)0x0,0,0);
  if (local_10c != 0) {
    local_128.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_128.filename = local_128.filename + 1;
    local_128.line = 0x8cb;
    local_128.funcname = "AddTxOutFee";
    logger::warn<int&>(&local_128,"wally_tx_add_raw_output NG[{}].",&local_10c);
    out.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_148,"vout fee add error.",
               (allocator *)
               ((long)&out.range_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(this_00,CVar4,message);
    out.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)local_248,local_20,(ConfidentialValue *)&asset_data);
  ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
  push_back(&this->vout_,(value_type *)local_248);
  sVar2 = ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
          ::size(&this->vout_);
  ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_248);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x4b0872);
  return (int)sVar2 - 1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOutFee(
    const Amount &value, const ConfidentialAssetId &asset) {
  if (vout_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vout maximum.");
    throw CfdException(kCfdIllegalStateError, "vout maximum.");
  }

  ConfidentialValue confidential_value = ConfidentialValue(value);
  const std::vector<uint8_t> &asset_data = asset.GetData().GetBytes();
  const std::vector<uint8_t> &value_data =
      confidential_value.GetData().GetBytes();

  int ret = wally_tx_add_elements_raw_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), nullptr, 0,
      asset_data.data(), asset_data.size(), value_data.data(),
      value_data.size(), nullptr, 0, nullptr, 0, nullptr, 0, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "vout fee add error.");
  }

  ConfidentialTxOut out(asset, confidential_value);
  vout_.push_back(out);
  return static_cast<uint32_t>(vout_.size() - 1);
}